

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsJacobianWRTControlSparsity
          (OptimalControlProblem *this,SparsityStructure *controlSparsity)

{
  OptimalControlProblemPimpl *pOVar1;
  bool bVar2;
  _Rb_tree_header *p_Var3;
  size_t sVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  size_t i;
  ulong index;
  long lVar8;
  size_t j;
  size_t newCol;
  NonZero NVar9;
  NonZero NVar10;
  ostringstream errorMsg;
  long local_1f0;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  SparsityStructure::clear(&this->m_pimpl->controlJacobianSparsity);
  p_Var6 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
  local_1f0 = 0;
  do {
    if ((_Rb_tree_header *)p_Var6 == p_Var3) {
      SparsityStructure::operator=(controlSparsity,&this->m_pimpl->controlJacobianSparsity);
LAB_00181ec5:
      return (_Rb_tree_header *)p_Var6 == p_Var3;
    }
    bVar2 = ConstraintsGroup::constraintJacobianWRTControlSparsity
                      ((ConstraintsGroup *)**(undefined8 **)(p_Var6 + 2),
                       (SparsityStructure *)(*(undefined8 **)(p_Var6 + 2) + 0x30));
    lVar5 = *(long *)(p_Var6 + 2);
    *(bool *)(lVar5 + 0x1e9) = bVar2;
    if (bVar2) {
      index = 0;
      while( true ) {
        sVar4 = SparsityStructure::size((SparsityStructure *)(lVar5 + 0x180));
        if (sVar4 <= index) break;
        pOVar1 = this->m_pimpl;
        NVar9 = SparsityStructure::operator[]
                          ((SparsityStructure *)(*(long *)(p_Var6 + 2) + 0x180),index);
        NVar10 = SparsityStructure::operator[]
                           ((SparsityStructure *)(*(long *)(p_Var6 + 2) + 0x180),index);
        SparsityStructure::add(&pOVar1->controlJacobianSparsity,NVar9.row + local_1f0,NVar10.col);
        index = index + 1;
        lVar5 = *(long *)(p_Var6 + 2);
      }
    }
    else {
      if ((this->m_pimpl->dynamicalSystem).
          super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        poVar7 = std::operator<<((ostream *)local_1a8,"The group ");
        ConstraintsGroup::name_abi_cxx11_
                  (&local_1c8,(ConstraintsGroup *)**(undefined8 **)(p_Var6 + 2));
        poVar7 = std::operator<<(poVar7,(string *)&local_1c8);
        std::operator<<(poVar7,
                        " has dense control jacobian and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown."
                       );
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","constraintJacobianWRTControlSparsity",
                   local_1c8._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        goto LAB_00181ec5;
      }
      lVar5 = iDynTree::MatrixDynSize::rows();
      sVar4 = iDynTree::MatrixDynSize::cols();
      for (lVar8 = 0; lVar8 != lVar5; lVar8 = lVar8 + 1) {
        for (newCol = 0; sVar4 != newCol; newCol = newCol + 1) {
          SparsityStructure::add(&this->m_pimpl->controlJacobianSparsity,lVar8 + local_1f0,newCol);
        }
      }
    }
    lVar5 = iDynTree::MatrixDynSize::rows();
    local_1f0 = local_1f0 + lVar5;
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

bool OptimalControlProblem::constraintsJacobianWRTControlSparsity(SparsityStructure &controlSparsity)
        {
            size_t offset = 0;
            m_pimpl->controlJacobianSparsity.clear();
            for (auto& group : m_pimpl->constraintsGroups){

                group.second->hasControlJacobianSparsity = group.second->group_ptr->constraintJacobianWRTControlSparsity(group.second->controlJacobianSparsity);

                if (group.second->hasControlJacobianSparsity) {

                    for (size_t i = 0; i < group.second->controlJacobianSparsity.size(); ++i) {
                        m_pimpl->controlJacobianSparsity.add(group.second->controlJacobianSparsity[i].row + offset,
                                                             group.second->controlJacobianSparsity[i].col);
                    }

                } else {

                    if (m_pimpl->dynamicalSystem) {

                        size_t rows = group.second->controlJacobianBuffer.rows();
                        size_t cols = group.second->controlJacobianBuffer.cols();

                        for (size_t i = 0; i < rows; ++i) {
                            for (size_t j = 0; j < cols; ++j) {
                                m_pimpl->controlJacobianSparsity.add(i + offset, j);
                            }
                        }
                    } else {
                        std::ostringstream errorMsg;
                        errorMsg << "The group " << group.second->group_ptr->name() <<" has dense control jacobian and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown.";
                        reportError("OptimalControlProblem", "constraintJacobianWRTControlSparsity", errorMsg.str().c_str());
                        return false;
                    }
                }

                offset += group.second->controlJacobianBuffer.rows();
            }

            controlSparsity = m_pimpl->controlJacobianSparsity;

            return true;
        }